

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

Result __thiscall wabt::SharedValidator::OnBr(SharedValidator *this,Location *loc,Var *depth)

{
  Result RVar1;
  Result RVar2;
  
  RVar1 = CheckInstr(this,(Opcode)0xc,loc);
  if (depth->type_ == Index) {
    RVar2 = TypeChecker::OnBr(&this->typechecker_,(depth->field_2).index_);
    RVar1.enum_._0_1_ = RVar2.enum_ == Error || RVar1.enum_ == Error;
    RVar1.enum_._1_3_ = 0;
    return (Result)RVar1.enum_;
  }
  __assert_fail("is_index()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/ir.h"
                ,0x3b,"Index wabt::Var::index() const");
}

Assistant:

Result SharedValidator::OnBr(const Location& loc, Var depth) {
  Result result = CheckInstr(Opcode::Br, loc);
  result |= typechecker_.OnBr(depth.index());
  return result;
}